

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::Unlock(CWallet *this,CKeyingMaterial *vMasterKeyIn)

{
  char cVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  bool bVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  for (p_Var2 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar3 = (_Rb_tree_header *)p_Var2 ==
              &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header, !bVar3;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    cVar1 = (**(code **)(**(long **)(p_Var2 + 2) + 0x20))(*(long **)(p_Var2 + 2),vMasterKeyIn);
    if (cVar1 == '\0') goto LAB_00518770;
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::operator=
            (&this->vMasterKey,vMasterKeyIn);
LAB_00518770:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (bVar3) {
    boost::signals2::
    signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyStatusChanged,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::Unlock(const CKeyingMaterial& vMasterKeyIn)
{
    {
        LOCK(cs_wallet);
        for (const auto& spk_man_pair : m_spk_managers) {
            if (!spk_man_pair.second->CheckDecryptionKey(vMasterKeyIn)) {
                return false;
            }
        }
        vMasterKey = vMasterKeyIn;
    }
    NotifyStatusChanged(this);
    return true;
}